

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

Point2f __thiscall
pbrt::PlanarMapping2D::Map
          (PlanarMapping2D *this,TextureEvalContext ctx,Vector2f *dstdx,Vector2f *dstdy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->vs).super_Tuple3<pbrt::Vector3,_float>.y)),
                           ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->vs).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->vt).super_Tuple3<pbrt::Vector3,_float>.y)),
                           ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->vt).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->vs).super_Tuple3<pbrt::Vector3,_float>.z));
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->vt).super_Tuple3<pbrt::Vector3,_float>.z));
  (dstdx->super_Tuple2<pbrt::Vector2,_float>).x = auVar1._0_4_;
  (dstdx->super_Tuple2<pbrt::Vector2,_float>).y = auVar2._0_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->vs).super_Tuple3<pbrt::Vector3,_float>.y)),
                           ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->vs).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->vt).super_Tuple3<pbrt::Vector3,_float>.y)),
                           ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->vt).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->vs).super_Tuple3<pbrt::Vector3,_float>.z));
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->vt).super_Tuple3<pbrt::Vector3,_float>.z));
  (dstdy->super_Tuple2<pbrt::Vector2,_float>).x = auVar1._0_4_;
  (dstdy->super_Tuple2<pbrt::Vector2,_float>).y = auVar2._0_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this->vs).super_Tuple3<pbrt::Vector3,_float>.y)),
                           ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)(this->vs).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this->vt).super_Tuple3<pbrt::Vector3,_float>.y)),
                           ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)(this->vt).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this->vs).super_Tuple3<pbrt::Vector3,_float>.z));
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this->vt).super_Tuple3<pbrt::Vector3,_float>.z));
  auVar1 = vinsertps_avx(ZEXT416((uint)(auVar1._0_4_ + this->ds)),
                         ZEXT416((uint)(auVar2._0_4_ + this->dt)),0x10);
  return (Point2f)auVar1._0_8_;
}

Assistant:

PBRT_CPU_GPU inline T Dot(const Vector3<T> &v, const Vector3<T> &w) {
    DCHECK(!v.HasNaN() && !w.HasNaN());
    return v.x * w.x + v.y * w.y + v.z * w.z;
}